

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O1

result_type __thiscall
Well<unsigned_int,_32UL,_624UL,_31UL,_203UL,_613UL,_123UL,_Detail::M3<7>,_Detail::M1,_Detail::M3<12>,_Detail::M3<-10>,_Detail::M3<-19>,_Detail::M2<-11>,_Detail::M3<4>,_Detail::M3<-10>,_Detail::NoTempering>
::operator()(Well<unsigned_int,_32UL,_624UL,_31UL,_203UL,_613UL,_123UL,_Detail::M3<7>,_Detail::M1,_Detail::M3<12>,_Detail::M3<_10>,_Detail::M3<_19>,_Detail::M2<_11>,_Detail::M3<4>,_Detail::M3<_10>,_Detail::NoTempering>
             *this)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
  sVar4 = this->index_;
  uVar1 = sVar4 + 0x26f;
  if (uVar1 < 0x4e0) {
    uVar5 = sVar4 - 1;
    if (uVar1 < 0x270) {
      uVar5 = uVar1;
    }
    uVar1 = sVar4 + 0x26e;
    if (uVar1 < 0x4e0) {
      uVar7 = sVar4 - 2;
      if (uVar1 < 0x270) {
        uVar7 = uVar1;
      }
      uVar1 = sVar4 + 0xcb;
      if (uVar1 < 0x4e0) {
        uVar11 = sVar4 + 0x265;
        uVar10 = sVar4 - 0x1a5;
        if (uVar1 < 0x270) {
          uVar10 = uVar1;
        }
        if ((uVar11 < 0x4e0) && (uVar1 = sVar4 + 0x7b, uVar1 < 0x4e0)) {
          uVar2 = this->state_[uVar5];
          uVar3 = this->state_[uVar7];
          uVar7 = sVar4 - 0xb;
          if (uVar11 < 0x270) {
            uVar7 = uVar11;
          }
          uVar8 = this->state_[sVar4] >> 7 ^ this->state_[sVar4] ^ this->state_[uVar10];
          uVar11 = sVar4 - 0x1f5;
          if (uVar1 < 0x270) {
            uVar11 = uVar1;
          }
          uVar6 = this->state_[uVar7] ^ this->state_[uVar11] ^
                  this->state_[uVar11] << 10 ^ this->state_[uVar7] >> 0xc;
          uVar9 = uVar6 ^ uVar8;
          this->state_[sVar4] = uVar9;
          uVar8 = uVar9 << 10 ^
                  uVar6 >> 4 ^
                  uVar8 << 0xb ^ uVar3 << 0x13 ^ (uVar3 & 0x7fffffff | uVar2 & 0x80000000) ^ uVar8;
          this->state_[uVar5] = uVar8;
          this->index_ = uVar5;
          return uVar8;
        }
      }
    }
  }
  __assert_fail("value < 2 * r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sehe[P]well-random/well.hpp"
                ,0x9e,
                "static T Detail::Modulo<unsigned long, 624>::calc(T, std::false_type) [UIntType = unsigned long, r = 624, T = unsigned long]"
               );
}

Assistant:

result_type operator()()
    {
        const UIntType upper_mask = ~0U << p;
        const UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        std::size_t i = index_;
        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        std::size_t j = i + r;
        std::size_t k = mod(j - 1); // [i,r-1]
        std::size_t l = mod(j - 2); // [i,r-2]

        std::size_t im1 = i + m1;
        std::size_t im2 = i + m2;
        std::size_t im3 = i + m3;

        UIntType z0, z1, z2, z3, z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state(im1));
        z2 = T2::transform(state(im2)) ^
             T3::transform(state(im3));
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<r>(z4, state_, im2);
    }